

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setWindowModified(QWidget *this,bool mod)

{
  QWidgetPrivate *this_00;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  setAttribute(this,WA_WindowModified,mod);
  QWidgetPrivate::setWindowModified_helper(this_00);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_28,ModifiedChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_28);
  QEvent::~QEvent((QEvent *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setWindowModified(bool mod)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_WindowModified, mod);

    d->setWindowModified_helper();

    QEvent e(QEvent::ModifiedChange);
    QCoreApplication::sendEvent(this, &e);
}